

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkUtil.c
# Opt level: O2

int Nwk_ManGetFaninMax(Nwk_Man_t *pNtk)

{
  void *pvVar1;
  int i;
  int iVar2;
  
  iVar2 = 0;
  for (i = 0; i < pNtk->vObjs->nSize; i = i + 1) {
    pvVar1 = Vec_PtrEntry(pNtk->vObjs,i);
    if (((pvVar1 != (void *)0x0) && ((*(uint *)((long)pvVar1 + 0x20) & 7) == 3)) &&
       (iVar2 <= *(int *)((long)pvVar1 + 0x3c))) {
      iVar2 = *(int *)((long)pvVar1 + 0x3c);
    }
  }
  return iVar2;
}

Assistant:

int Nwk_ManGetFaninMax( Nwk_Man_t * pNtk )
{
    Nwk_Obj_t * pNode;
    int i, nFaninsMax = 0;
    Nwk_ManForEachNode( pNtk, pNode, i )
    {
        if ( nFaninsMax < Nwk_ObjFaninNum(pNode) )
            nFaninsMax = Nwk_ObjFaninNum(pNode);
    }
    return nFaninsMax;
}